

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_backend_sched_split *pgVar1;
  ggml_backend_t pgVar2;
  int *piVar3;
  ggml_tensor **ppgVar4;
  ggml_tensor *dst;
  _func_void_ggml_backend_t_ggml_backend_event_t *p_Var5;
  _func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *p_Var6;
  _func_void_ggml_backend_t *p_Var7;
  _Bool _Var8;
  _Bool _Var9;
  int iVar10;
  ggml_status gVar11;
  size_t sVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  ggml_tensor *pgVar16;
  int iVar17;
  ggml_backend_event_t pgVar18;
  ggml_tensor **ppgVar19;
  long lVar20;
  ggml_backend_t pgVar21;
  ggml_cgraph local_80;
  
  if ((sched->is_reset == false) && (sched->is_alloc == false)) {
    ggml_backend_sched_reset(sched);
  }
  if ((sched->is_alloc == false) && (_Var8 = ggml_backend_sched_alloc_graph(sched,graph), !_Var8)) {
    return GGML_STATUS_ALLOC_FAILED;
  }
  if (0 < sched->n_splits) {
    pgVar1 = sched->splits;
    ppgVar19 = pgVar1->inputs;
    lVar13 = 0;
    do {
      lVar15 = (long)pgVar1[lVar13].backend_id;
      pgVar2 = sched->backends[lVar15];
      if (0 < pgVar1[lVar13].n_inputs) {
        lVar20 = 0;
        do {
          piVar3 = sched->hv_tensor_backend_ids;
          sVar12 = ggml_hash_find_or_insert(&sched->hash_set,ppgVar19[lVar20]);
          if ((long)piVar3[sVar12] == -1) {
            pgVar21 = (ggml_backend_t)0x0;
          }
          else {
            pgVar21 = sched->backends[piVar3[sVar12]];
          }
          pgVar16 = ppgVar19[lVar20];
          ppgVar4 = sched->hv_tensor_copies;
          sVar12 = ggml_hash_find_or_insert(&sched->hash_set,pgVar16);
          dst = ppgVar4[(long)sched->n_backends * (long)sched->n_copies * sVar12 +
                        sched->n_copies * lVar15 + (long)sched->cur_copy];
          pgVar18 = sched->events[lVar15][sched->cur_copy];
          if ((pgVar16->flags & 1) == 0) {
            if (pgVar18 == (ggml_backend_event_t)0x0) {
              p_Var7 = (pgVar2->iface).synchronize;
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar2);
              }
            }
            else {
              p_Var5 = (pgVar2->iface).event_wait;
              if (p_Var5 == (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0) {
                pcVar14 = "backend->iface.event_wait != NULL";
                iVar17 = 0x1bb;
                goto LAB_00127e40;
              }
              (*p_Var5)(pgVar2,pgVar18);
            }
            p_Var6 = (pgVar2->iface).cpy_tensor_async;
            if ((p_Var6 == (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr
                            *)0x0) || (_Var8 = (*p_Var6)(pgVar21,pgVar2,pgVar16,dst), !_Var8)) {
              p_Var7 = (pgVar21->iface).synchronize;
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar21);
              }
              pgVar18 = sched->events[lVar15][sched->cur_copy];
              if (pgVar18 != (ggml_backend_event_t)0x0) goto LAB_00127c28;
              p_Var7 = (pgVar2->iface).synchronize;
joined_r0x00127c36:
              if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
                (*p_Var7)(pgVar2);
              }
              goto LAB_00127c49;
            }
          }
          else {
            if (pgVar18 == (ggml_backend_event_t)0x0) {
              p_Var7 = (pgVar2->iface).synchronize;
              goto joined_r0x00127c36;
            }
LAB_00127c28:
            ggml_backend_event_synchronize(pgVar18);
LAB_00127c49:
            ggml_backend_tensor_copy(pgVar16,dst);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < pgVar1[lVar13].n_inputs);
      }
      if (sched->callback_eval == (ggml_backend_sched_eval_callback)0x0) {
        gVar11 = (*(pgVar2->iface).graph_compute)(pgVar2,&pgVar1[lVar13].graph);
        if (gVar11 != GGML_STATUS_SUCCESS) {
          return gVar11;
        }
      }
      else if (0 < pgVar1[lVar13].graph.n_nodes) {
        iVar17 = 0;
        do {
          lVar20 = (long)iVar17;
          pgVar16 = pgVar1[lVar13].graph.nodes[lVar20];
          _Var8 = (*sched->callback_eval)(pgVar16,true,sched->callback_eval_user_data);
          _Var9 = true;
          iVar10 = iVar17;
          if (!_Var8) {
            if (iVar17 < pgVar1[lVar13].graph.n_nodes + -1) {
              do {
                iVar10 = iVar10 + 1;
                pgVar16 = pgVar1[lVar13].graph.nodes[lVar20 + 1];
                _Var9 = (*sched->callback_eval)(pgVar16,true,sched->callback_eval_user_data);
                if (_Var9) break;
                lVar20 = lVar20 + 1;
              } while (lVar20 < (long)pgVar1[lVar13].graph.n_nodes + -1);
            }
            else {
              _Var9 = false;
            }
          }
          iVar10 = iVar10 + 1;
          ggml_graph_view(&local_80,&pgVar1[lVar13].graph,iVar17,iVar10);
          gVar11 = (*(pgVar2->iface).graph_compute)(pgVar2,&local_80);
          if (gVar11 != GGML_STATUS_SUCCESS) {
            return gVar11;
          }
          p_Var7 = (pgVar2->iface).synchronize;
          if (p_Var7 != (_func_void_ggml_backend_t *)0x0) {
            (*p_Var7)(pgVar2);
          }
        } while (((_Var9 == false) ||
                 (_Var8 = (*sched->callback_eval)(pgVar16,false,sched->callback_eval_user_data),
                 _Var8)) && (iVar17 = iVar10, iVar10 < pgVar1[lVar13].graph.n_nodes));
      }
      if ((0 < pgVar1[lVar13].n_inputs) &&
         (pgVar18 = sched->events[lVar15][sched->cur_copy], pgVar18 != (ggml_backend_event_t)0x0)) {
        p_Var5 = (pgVar2->iface).event_record;
        if (p_Var5 == (_func_void_ggml_backend_t_ggml_backend_event_t *)0x0) {
          pcVar14 = "backend->iface.event_record != NULL";
          iVar17 = 0x1af;
LAB_00127e40:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                     ,iVar17,"GGML_ASSERT(%s) failed",pcVar14);
        }
        (*p_Var5)(pgVar2,pgVar18);
      }
      lVar13 = lVar13 + 1;
      ppgVar19 = ppgVar19 + 0x17;
    } while (lVar13 < sched->n_splits);
  }
  sched->cur_copy = (sched->cur_copy + 1) % sched->n_copies;
  return GGML_STATUS_SUCCESS;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    if (!sched->is_reset && !sched->is_alloc) {
        ggml_backend_sched_reset(sched);
    }

    if (!sched->is_alloc) {
        if (!ggml_backend_sched_alloc_graph(sched, graph)) {
            return GGML_STATUS_ALLOC_FAILED;
        }
    }

    return ggml_backend_sched_compute_splits(sched);
}